

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

void Dar_LibDumpPriorities(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  printf("\nOutput priorities (total = %d):\n",(ulong)(uint)s_DarLib->nSubgrTotal);
  lVar5 = 0;
  iVar3 = 0;
  iVar6 = 0;
  do {
    if (0 < s_DarLib->nSubgr[lVar5]) {
      lVar4 = 0;
      do {
        iVar1 = s_DarLib->pPrios[lVar5][lVar4];
        iVar2 = iVar1;
        if (lVar4 != 0) {
          iVar2 = s_DarLib->pPrios[lVar5][lVar4 + -1];
        }
        if (s_DarLib->pScore[lVar5][iVar2] < s_DarLib->pScore[lVar5][iVar1]) {
          __assert_fail("s_DarLib->pScore[i][Out2] >= s_DarLib->pScore[i][Out]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                        ,0x2a7,"void Dar_LibDumpPriorities()");
        }
        printf("%d, ");
        iVar6 = iVar6 + 1;
        if (iVar6 == 0xf) {
          putchar(10);
          iVar6 = 0;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < s_DarLib->nSubgr[lVar5]);
      iVar3 = iVar3 + (int)lVar4;
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 0xde) {
      putchar(10);
      if (iVar3 == s_DarLib->nSubgrTotal) {
        return;
      }
      __assert_fail("Printed == s_DarLib->nSubgrTotal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                    ,0x2b3,"void Dar_LibDumpPriorities()");
    }
  } while( true );
}

Assistant:

void Dar_LibDumpPriorities()
{
    int i, k, Out, Out2, Counter = 0, Printed = 0;
    printf( "\nOutput priorities (total = %d):\n", s_DarLib->nSubgrTotal );
    for ( i = 0; i < 222; i++ )
    {
//        printf( "Class%d: ", i );
        for ( k = 0; k < s_DarLib->nSubgr[i]; k++ )
        {
            Out = s_DarLib->pPrios[i][k];
            Out2 = k == 0 ? Out : s_DarLib->pPrios[i][k-1];
            assert( s_DarLib->pScore[i][Out2] >= s_DarLib->pScore[i][Out] );
//            printf( "%d(%d), ", Out, s_DarLib->pScore[i][Out] );
            printf( "%d, ", Out );
            Printed++;
            if ( ++Counter == 15 )
            {
                printf( "\n" );
                Counter = 0;
            }
        }
    }
    printf( "\n" );
    assert( Printed == s_DarLib->nSubgrTotal );
}